

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O1

void __thiscall fineftp::FtpSession::handleFtpCommand(FtpSession *this,string *command)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar6;
  long lVar7;
  const_iterator cVar8;
  undefined8 uVar9;
  long lVar10;
  size_type sVar11;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  __l;
  string ftp_command;
  string parameters;
  size_type __dnew;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  command_map;
  allocator_type local_cda;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_cd9;
  key_type local_cd8;
  undefined1 *local_cb8;
  long local_cb0;
  undefined1 local_ca8;
  undefined7 uStack_ca7;
  undefined8 local_c98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c90;
  long *local_c88 [2];
  long local_c78 [2];
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  local_c50;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c20;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c08;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_bf0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_bd8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_bc0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ba8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b90;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b78;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b60;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b48;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b30;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b18;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b00;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ae8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ad0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ab8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_aa0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a88;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a70;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a58;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a40;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a28;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a10;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9f8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9e0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9c8;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9b0;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_998;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_980;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_968;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_950;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_938;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_920;
  _Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_908;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_8f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_8b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_870;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_830;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_7f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_7b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_770;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_730;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_6f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_6b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_670;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_5f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_5b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_570;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_530;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_4b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_70;
  
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  local_cd8._M_string_length = 0;
  local_cd8.field_2._M_local_buf[0] = '\0';
  local_cb8 = &local_ca8;
  local_cb0 = 0;
  local_ca8 = 0;
  lVar7 = ::std::__cxx11::string::find((char)command,0x20);
  ::std::__cxx11::string::substr((ulong)&local_8f0,(ulong)command);
  ::std::__cxx11::string::operator=((string *)&local_cd8,(string *)&local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.first._M_dataplus._M_p != &local_8f0.first.field_2) {
    operator_delete(local_8f0.first._M_dataplus._M_p,
                    (ulong)(local_8f0.first.field_2._M_allocated_capacity + 1));
  }
  sVar5 = local_cd8._M_string_length;
  _Var4._M_p = local_cd8._M_dataplus._M_p;
  if (local_cd8._M_string_length != 0) {
    sVar11 = 0;
    do {
      iVar6 = toupper((uint)(byte)_Var4._M_p[sVar11]);
      _Var4._M_p[sVar11] = (char)iVar6;
      sVar11 = sVar11 + 1;
    } while (sVar5 != sVar11);
  }
  paVar1 = &local_8f0.first.field_2;
  if (lVar7 != -1) {
    ::std::__cxx11::string::substr((ulong)&local_8f0,(ulong)command);
    ::std::__cxx11::string::operator=((string *)&local_cb8,(string *)&local_8f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_8f0.first._M_dataplus._M_p,
                      (ulong)(local_8f0.first.field_2._M_allocated_capacity + 1));
    }
  }
  local_c68._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandUSER;
  local_c68._8_8_ = 0;
  local_c68._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_8f0,(char (*) [5])"USER",&local_c68);
  local_908._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandPASS;
  local_908._8_8_ = 0;
  local_908._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_8b0,(char (*) [5])"PASS",&local_908);
  local_920._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandACCT;
  local_920._8_8_ = 0;
  local_920._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_870,(char (*) [5])"ACCT",&local_920);
  local_938._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandCWD;
  local_938._8_8_ = 0;
  local_938._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_830,(char (*) [4])"CWD",&local_938);
  local_950._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandCDUP;
  local_950._8_8_ = 0;
  local_950._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_7f0,(char (*) [5])"CDUP",&local_950);
  local_968._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandREIN;
  local_968._8_8_ = 0;
  local_968._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_7b0,(char (*) [5])"REIN",&local_968);
  local_980._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandQUIT;
  local_980._8_8_ = 0;
  local_980._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_770,(char (*) [5])"QUIT",&local_980);
  local_998._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandPORT;
  local_998._8_8_ = 0;
  local_998._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_730,(char (*) [5])"PORT",&local_998);
  local_9b0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandPASV;
  local_9b0._8_8_ = 0;
  local_9b0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_6f0,(char (*) [5])"PASV",&local_9b0);
  local_9c8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandTYPE;
  local_9c8._8_8_ = 0;
  local_9c8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_6b0,(char (*) [5])"TYPE",&local_9c8);
  local_9e0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSTRU;
  local_9e0._8_8_ = 0;
  local_9e0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_670,(char (*) [5])"STRU",&local_9e0);
  local_9f8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandMODE;
  local_9f8._8_8_ = 0;
  local_9f8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_630,(char (*) [5])"MODE",&local_9f8);
  local_a10._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandRETR;
  local_a10._8_8_ = 0;
  local_a10._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_5f0,(char (*) [5])"RETR",&local_a10);
  local_a28._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSTOR;
  local_a28._8_8_ = 0;
  local_a28._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_5b0,(char (*) [5])"STOR",&local_a28);
  local_a40._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSTOU;
  local_a40._8_8_ = 0;
  local_a40._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_570,(char (*) [5])"STOU",&local_a40);
  local_a58._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandAPPE;
  local_a58._8_8_ = 0;
  local_a58._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_530,(char (*) [5])"APPE",&local_a58);
  local_a70._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandALLO;
  local_a70._8_8_ = 0;
  local_a70._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_4f0,(char (*) [5])"ALLO",&local_a70);
  local_a88._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandREST;
  local_a88._8_8_ = 0;
  local_a88._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_4b0,(char (*) [5])"REST",&local_a88);
  local_aa0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandRNFR;
  local_aa0._8_8_ = 0;
  local_aa0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_470,(char (*) [5])"RNFR",&local_aa0);
  local_ab8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandRNTO;
  local_ab8._8_8_ = 0;
  local_ab8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_430,(char (*) [5])"RNTO",&local_ab8);
  local_ad0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandABOR;
  local_ad0._8_8_ = 0;
  local_ad0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_3f0,(char (*) [5])"ABOR",&local_ad0);
  local_ae8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandDELE;
  local_ae8._8_8_ = 0;
  local_ae8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_3b0,(char (*) [5])"DELE",&local_ae8);
  local_b00._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandRMD;
  local_b00._8_8_ = 0;
  local_b00._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_370,(char (*) [4])"RMD",&local_b00);
  local_b18._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandMKD;
  local_b18._8_8_ = 0;
  local_b18._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_330,(char (*) [4])"MKD",&local_b18);
  local_b30._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandPWD;
  local_b30._8_8_ = 0;
  local_b30._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[4],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_2f0,(char (*) [4])"PWD",&local_b30);
  local_b48._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandLIST;
  local_b48._8_8_ = 0;
  local_b48._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_2b0,(char (*) [5])"LIST",&local_b48);
  local_b60._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandNLST;
  local_b60._8_8_ = 0;
  local_b60._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_270,(char (*) [5])"NLST",&local_b60);
  local_b78._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSITE;
  local_b78._8_8_ = 0;
  local_b78._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_230,(char (*) [5])"SITE",&local_b78);
  local_b90._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSYST;
  local_b90._8_8_ = 0;
  local_b90._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_1f0,(char (*) [5])"SYST",&local_b90);
  local_ba8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSTAT;
  local_ba8._8_8_ = 0;
  local_ba8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_1b0,(char (*) [5])"STAT",&local_ba8);
  local_bc0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandHELP;
  local_bc0._8_8_ = 0;
  local_bc0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_170,(char (*) [5])"HELP",&local_bc0);
  local_bd8._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandNOOP;
  local_bd8._8_8_ = 0;
  local_bd8._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_130,(char (*) [5])"NOOP",&local_bd8);
  local_bf0._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandFEAT;
  local_bf0._8_8_ = 0;
  local_bf0._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_f0,(char (*) [5])"FEAT",&local_bf0);
  local_c08._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandOPTS;
  local_c08._8_8_ = 0;
  local_c08._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_b0,(char (*) [5])"OPTS",&local_c08);
  local_c20._M_f = (offset_in_FtpSession_to_subr)handleFtpCommandSIZE;
  local_c20._8_8_ = 0;
  local_c20._M_bound_args.super__Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_fineftp::FtpSession_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_fineftp::FtpSession_*,_std::_Placeholder<1>_>)this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  ::
  pair<const_char_(&)[5],_std::_Bind<void_(fineftp::FtpSession::*(fineftp::FtpSession_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_true>
            (&local_70,(char (*) [5])"SIZE",&local_c20);
  __l._M_len = 0x23;
  __l._M_array = &local_8f0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
         *)&local_c50,__l,&local_cd9,&local_cda);
  lVar7 = 0;
  do {
    pcVar2 = *(code **)((long)&local_70.second.super__Function_base._M_manager + lVar7);
    if (pcVar2 != (code *)0x0) {
      lVar10 = (long)&local_70.second.super__Function_base._M_functor + lVar7;
      (*pcVar2)(lVar10,lVar10,3);
    }
    pcVar3 = *(char **)((long)&local_70.first._M_dataplus._M_p + lVar7);
    if (local_70.first.field_2._M_local_buf + lVar7 != pcVar3) {
      operator_delete(pcVar3,*(long *)((long)&local_70.first.field_2 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x40;
  } while (lVar7 != -0x8c0);
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
          ::find(&local_c50,&local_cd8);
  if ((_Rb_tree_header *)cVar8._M_node == &local_c50._M_impl.super__Rb_tree_header) {
    local_c68._M_f = 0x14;
    local_8f0.first._M_dataplus._M_p = (pointer)paVar1;
    local_8f0.first._M_dataplus._M_p =
         (pointer)::std::__cxx11::string::_M_create((ulong *)&local_8f0,(ulong)&local_c68);
    local_8f0.first.field_2._M_allocated_capacity = local_c68._M_f;
    builtin_strncpy(local_8f0.first._M_dataplus._M_p,"Unrecognized command",0x14);
    local_8f0.first._M_string_length = local_c68._M_f;
    local_8f0.first._M_dataplus._M_p[local_c68._M_f] = '\0';
    sendFtpMessage(this,SYNTAX_ERROR_UNRECOGNIZED_COMMAND,&local_8f0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_8f0.first._M_dataplus._M_p,
                      (ulong)(local_8f0.first.field_2._M_allocated_capacity + 1));
    }
  }
  else {
    local_c88[0] = local_c78;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_c88,local_cb8,local_cb8 + local_cb0)
    ;
    if (cVar8._M_node[2]._M_left == (_Base_ptr)0x0) {
      uVar9 = ::std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_8f0.first._M_dataplus._M_p,
                        (ulong)(local_8f0.first.field_2._M_allocated_capacity + 1));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
      ::~_Rb_tree(&local_c50);
      if (local_cb8 != &local_ca8) {
        operator_delete(local_cb8,CONCAT71(uStack_ca7,local_ca8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
        operator_delete(local_cd8._M_dataplus._M_p,
                        CONCAT71(local_cd8.field_2._M_allocated_capacity._1_7_,
                                 local_cd8.field_2._M_local_buf[0]) + 1);
      }
      _Unwind_Resume(uVar9);
    }
    (*(code *)cVar8._M_node[2]._M_right)(cVar8._M_node + 2,local_c88);
    if (local_c88[0] != local_c78) {
      operator_delete(local_c88[0],local_c78[0] + 1);
    }
    ::std::__cxx11::string::_M_assign((string *)&this->last_command_);
  }
  iVar6 = ::std::__cxx11::string::compare((char *)&this->last_command_);
  if (iVar6 == 0) {
    ::std::__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<fineftp::FtpSession,void>
              ((__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2> *)&local_c98,
               (__weak_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
    this_00 = p_Stack_c90;
    local_c98 = 0;
    p_Stack_c90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_c90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c90);
    }
  }
  else {
    readFtpCommand(this);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::~_Rb_tree(&local_c50);
  if (local_cb8 != &local_ca8) {
    operator_delete(local_cb8,CONCAT71(uStack_ca7,local_ca8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p,
                    CONCAT71(local_cd8.field_2._M_allocated_capacity._1_7_,
                             local_cd8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommand(const std::string& command)
  {
    std::string ftp_command;
    std::string parameters;

    size_t space_index = command.find_first_of(' ');

    ftp_command = command.substr(0, space_index);
    std::transform(ftp_command.begin(), ftp_command.end(), ftp_command.begin(), [](char c) { return static_cast<char>(std::toupper(static_cast<unsigned char>(c))); });

    if (space_index != std::string::npos)
    {
      parameters = command.substr(space_index + 1, std::string::npos);
    }


    const std::map<std::string, std::function<void(std::string)>> command_map {
      // Access control commands
      { "USER", std::bind(&FtpSession::handleFtpCommandUSER, this, std::placeholders::_1) },
      { "PASS", std::bind(&FtpSession::handleFtpCommandPASS, this, std::placeholders::_1) },
      { "ACCT", std::bind(&FtpSession::handleFtpCommandACCT, this, std::placeholders::_1) },
      { "CWD",  std::bind(&FtpSession::handleFtpCommandCWD,  this, std::placeholders::_1) },
      { "CDUP", std::bind(&FtpSession::handleFtpCommandCDUP, this, std::placeholders::_1) },
      { "REIN", std::bind(&FtpSession::handleFtpCommandREIN, this, std::placeholders::_1) },
      { "QUIT", std::bind(&FtpSession::handleFtpCommandQUIT, this, std::placeholders::_1) },

      // Transfer parameter commands
      { "PORT", std::bind(&FtpSession::handleFtpCommandPORT, this, std::placeholders::_1) },
      { "PASV", std::bind(&FtpSession::handleFtpCommandPASV, this, std::placeholders::_1) },
      { "TYPE", std::bind(&FtpSession::handleFtpCommandTYPE, this, std::placeholders::_1) },
      { "STRU", std::bind(&FtpSession::handleFtpCommandSTRU, this, std::placeholders::_1) },
      { "MODE", std::bind(&FtpSession::handleFtpCommandMODE, this, std::placeholders::_1) },

      // Ftp service commands
      { "RETR", std::bind(&FtpSession::handleFtpCommandRETR, this, std::placeholders::_1) },
      { "STOR", std::bind(&FtpSession::handleFtpCommandSTOR, this, std::placeholders::_1) },
      { "STOU", std::bind(&FtpSession::handleFtpCommandSTOU, this, std::placeholders::_1) },
      { "APPE", std::bind(&FtpSession::handleFtpCommandAPPE, this, std::placeholders::_1) },
      { "ALLO", std::bind(&FtpSession::handleFtpCommandALLO, this, std::placeholders::_1) },
      { "REST", std::bind(&FtpSession::handleFtpCommandREST, this, std::placeholders::_1) },
      { "RNFR", std::bind(&FtpSession::handleFtpCommandRNFR, this, std::placeholders::_1) },
      { "RNTO", std::bind(&FtpSession::handleFtpCommandRNTO, this, std::placeholders::_1) },
      { "ABOR", std::bind(&FtpSession::handleFtpCommandABOR, this, std::placeholders::_1) },
      { "DELE", std::bind(&FtpSession::handleFtpCommandDELE, this, std::placeholders::_1) },
      { "RMD",  std::bind(&FtpSession::handleFtpCommandRMD,  this, std::placeholders::_1) },
      { "MKD",  std::bind(&FtpSession::handleFtpCommandMKD,  this, std::placeholders::_1) },
      { "PWD",  std::bind(&FtpSession::handleFtpCommandPWD,  this, std::placeholders::_1) },
      { "LIST", std::bind(&FtpSession::handleFtpCommandLIST, this, std::placeholders::_1) },
      { "NLST", std::bind(&FtpSession::handleFtpCommandNLST, this, std::placeholders::_1) },
      { "SITE", std::bind(&FtpSession::handleFtpCommandSITE, this, std::placeholders::_1) },
      { "SYST", std::bind(&FtpSession::handleFtpCommandSYST, this, std::placeholders::_1) },
      { "STAT", std::bind(&FtpSession::handleFtpCommandSTAT, this, std::placeholders::_1) },
      { "HELP", std::bind(&FtpSession::handleFtpCommandHELP, this, std::placeholders::_1) },
      { "NOOP", std::bind(&FtpSession::handleFtpCommandNOOP, this, std::placeholders::_1) },

      // Modern FTP Commands
      { "FEAT", std::bind(&FtpSession::handleFtpCommandFEAT, this, std::placeholders::_1) },
      { "OPTS", std::bind(&FtpSession::handleFtpCommandOPTS, this, std::placeholders::_1) },
      { "SIZE", std::bind(&FtpSession::handleFtpCommandSIZE, this, std::placeholders::_1) },
    };

    auto command_it = command_map.find(ftp_command);
    if (command_it != command_map.end())
    {
      command_it->second(parameters);
      last_command_ = ftp_command;
    }
    else
    {
      sendFtpMessage(FtpReplyCode::SYNTAX_ERROR_UNRECOGNIZED_COMMAND, "Unrecognized command");
    }

    if (last_command_ == "QUIT")
    {
      // Close command socket
      command_write_strand_.wrap([me = shared_from_this()]() { me->command_socket_.close();  });
    }
    else
    {
      // Wait for next command
      readFtpCommand();
    }
  }